

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

uint * Kit_DsdTruthCompute(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk)

{
  int iVar1;
  uint *puVar2;
  uint *pIn;
  int local_24;
  int i;
  uint *pTruthRes;
  Kit_DsdNtk_t *pNtk_local;
  Kit_DsdMan_t *p_local;
  
  if ((int)(uint)pNtk->nVars <= p->nVars) {
    for (local_24 = 0; local_24 < (int)(uint)pNtk->nVars; local_24 = local_24 + 1) {
      puVar2 = (uint *)Vec_PtrEntry(p->vTtNodes,local_24);
      pIn = (uint *)Vec_PtrEntry(p->vTtElems,local_24);
      Kit_TruthCopy(puVar2,pIn,p->nVars);
    }
    iVar1 = Abc_Lit2Var((uint)pNtk->Root);
    puVar2 = Kit_DsdTruthComputeNode_rec(p,pNtk,iVar1);
    iVar1 = Abc_LitIsCompl((uint)pNtk->Root);
    if (iVar1 != 0) {
      Kit_TruthNot(puVar2,puVar2,(uint)pNtk->nVars);
    }
    return puVar2;
  }
  __assert_fail("pNtk->nVars <= p->nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                ,0x29d,"unsigned int *Kit_DsdTruthCompute(Kit_DsdMan_t *, Kit_DsdNtk_t *)");
}

Assistant:

unsigned * Kit_DsdTruthCompute( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk )
{
    unsigned * pTruthRes;
    int i;
    // assign elementary truth ables
    assert( pNtk->nVars <= p->nVars );
    for ( i = 0; i < (int)pNtk->nVars; i++ )
        Kit_TruthCopy( (unsigned *)Vec_PtrEntry(p->vTtNodes, i), (unsigned *)Vec_PtrEntry(p->vTtElems, i), p->nVars );
    // compute truth table for each node
    pTruthRes = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(pNtk->Root) );
    // complement the truth table if needed
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
    return pTruthRes;
}